

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *_output,void *input,size_t inlen,uint64_t seq
                      ,void *aad,size_t aadlen)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  uint8_t iv [32];
  int local_5c;
  uint8_t local_58 [40];
  
  uVar1 = _ctx->algo->tag_size;
  sVar3 = 0xffffffffffffffff;
  if (uVar1 <= inlen) {
    ptls_aead__build_iv(_ctx->algo,local_58,(uint8_t *)&_ctx[1].dispose_crypto,seq);
    iVar2 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                               (uchar *)0x0,local_58);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x54f,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    if (aadlen != 0) {
      iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)0x0,&local_5c,(uchar *)aad,
                                (int)aadlen);
      if (iVar2 == 0) {
        __assert_fail("ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                      ,0x552,
                      "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                     );
      }
    }
    iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)_output,&local_5c,
                              (uchar *)input,(int)inlen - (int)uVar1);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x555,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    lVar4 = (long)local_5c;
    iVar2 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,0x11,(int)uVar1,
                                (void *)((long)input + (inlen - uVar1)));
    if (iVar2 == 0) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      iVar2 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)((long)_output + lVar4),
                                  &local_5c);
      sVar3 = 0xffffffffffffffff;
      if (iVar2 != 0) {
        sVar3 = local_5c + lVar4;
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aesgcm_context *ctx = (void *)_ctx;

    if (inlen < 16)
        return SIZE_MAX;

    size_t enclen = inlen - 16;
    if (enclen + aadlen > ctx->aesgcm->capacity)
        ctx->aesgcm = ptls_fusion_aesgcm_set_capacity(ctx->aesgcm, enclen + aadlen);
    if (!ptls_fusion_aesgcm_decrypt(ctx->aesgcm, output, input, enclen, calc_counter(ctx, seq), aad, aadlen,
                                    (const uint8_t *)input + enclen))
        return SIZE_MAX;
    return enclen;
}